

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void SetAccessorRange<float>
               (Ref<glTF::Accessor> acc,void *data,uint count,uint numCompsIn,uint numCompsOut)

{
  Accessor *pAVar1;
  float *pfVar2;
  reference pvVar3;
  double dVar4;
  double valueTmp;
  uint j;
  float *buffer_end;
  float *buffer_ptr;
  size_t totalComps;
  double local_38;
  uint local_30;
  uint local_2c;
  uint i;
  uint numCompsOut_local;
  uint numCompsIn_local;
  uint count_local;
  void *data_local;
  Ref<glTF::Accessor> acc_local;
  
  data_local = acc.vector;
  acc_local.vector._0_4_ = acc.index;
  local_2c = numCompsOut;
  i = numCompsIn;
  numCompsOut_local = count;
  _numCompsIn_local = (float *)data;
  if (numCompsOut <= numCompsIn) {
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      pAVar1 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&data_local);
      local_38 = std::numeric_limits<double>::max();
      std::vector<double,_std::allocator<double>_>::push_back(&pAVar1->min,&local_38);
      pAVar1 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&data_local);
      dVar4 = std::numeric_limits<double>::max();
      totalComps = (size_t)-dVar4;
      std::vector<double,_std::allocator<double>_>::push_back
                (&pAVar1->max,(value_type_conflict6 *)&totalComps);
    }
    pfVar2 = _numCompsIn_local + numCompsOut_local * i;
    for (buffer_end = _numCompsIn_local; buffer_end < pfVar2; buffer_end = buffer_end + i) {
      for (valueTmp._4_4_ = 0; valueTmp._4_4_ < local_2c; valueTmp._4_4_ = valueTmp._4_4_ + 1) {
        dVar4 = (double)buffer_end[valueTmp._4_4_];
        pAVar1 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&data_local);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&pAVar1->min,(ulong)valueTmp._4_4_);
        if (dVar4 < *pvVar3) {
          pAVar1 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&data_local);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pAVar1->min,(ulong)valueTmp._4_4_);
          *pvVar3 = dVar4;
        }
        pAVar1 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&data_local);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&pAVar1->max,(ulong)valueTmp._4_4_);
        if (*pvVar3 <= dVar4 && dVar4 != *pvVar3) {
          pAVar1 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&data_local);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pAVar1->max,(ulong)valueTmp._4_4_);
          *pvVar3 = dVar4;
        }
      }
    }
    return;
  }
  __assert_fail("numCompsOut <= numCompsIn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFExporter.cpp"
                ,0xb6,
                "void SetAccessorRange(Ref<Accessor>, void *, unsigned int, unsigned int, unsigned int) [T = float]"
               );
}

Assistant:

void SetAccessorRange(Ref<Accessor> acc, void* data, unsigned int count,
	unsigned int numCompsIn, unsigned int numCompsOut)
{
	ai_assert(numCompsOut <= numCompsIn);

	// Allocate and initialize with large values.
	for (unsigned int i = 0 ; i < numCompsOut ; i++) {
		acc->min.push_back( std::numeric_limits<double>::max());
		acc->max.push_back(-std::numeric_limits<double>::max());
	}

	size_t totalComps = count * numCompsIn;
	T* buffer_ptr = static_cast<T*>(data);
	T* buffer_end = buffer_ptr + totalComps;

	// Search and set extreme values.
	for (; buffer_ptr < buffer_end ; buffer_ptr += numCompsIn) {
		for (unsigned int j = 0 ; j < numCompsOut ; j++) {
			double valueTmp = buffer_ptr[j];

			if (valueTmp < acc->min[j]) {
				acc->min[j] = valueTmp;
			}
			if (valueTmp > acc->max[j]) {
				acc->max[j] = valueTmp;
			}
		}
	}
}